

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonWriter.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::SkeletonWriter::DoPutSync
          (SkeletonWriter *this,Variable<long_double> *variable,longdouble *data)

{
  pointer pBVar1;
  pointer pBVar2;
  size_t stepsStart;
  BPInfo *blockInfo;
  pointer this_00;
  
  stepsStart = CurrentStep(this);
  blockInfo = Variable<long_double>::SetBlockInfo(variable,data,stepsStart,1);
  PutSyncCommon<long_double>(this,variable,blockInfo);
  pBVar1 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (variable->m_BlocksInfo).
           super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pBVar1;
  if (pBVar2 != pBVar1) {
    do {
      Variable<long_double>::BPInfo::~BPInfo(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pBVar2);
    (variable->m_BlocksInfo).
    super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  return;
}

Assistant:

void SkeletonWriter::Init()
{
    InitParameters();
    InitTransports();
}